

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

int __thiscall QMetaObject::indexOfProperty(QMetaObject *this,char *name)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  QMetaObject *pQVar5;
  bool bVar6;
  int iVar7;
  int unaff_EBP;
  int iVar8;
  int iVar9;
  QMetaObject *pQVar10;
  
  pQVar10 = this;
  do {
    if (pQVar10 == (QMetaObject *)0x0) {
      if (((this->d).data[0xc] & 1) == 0) {
        return -1;
      }
      iVar9 = (**(code **)((long)this[-1].d.extradata + 0x28))(&this[-1].d.extradata,name,0);
      return iVar9;
    }
    puVar3 = (pQVar10->d).data;
    uVar1 = puVar3[6];
    bVar6 = 0 < (int)uVar1;
    if (0 < (int)uVar1) {
      uVar2 = puVar3[7];
      puVar4 = (pQVar10->d).stringdata;
      iVar9 = 0;
      do {
        iVar7 = strcmp(name,(char *)((ulong)puVar4[(long)(int)puVar3[(long)(int)uVar2 +
                                                                     (long)(iVar9 * 5)] * 2] +
                                    (long)puVar4));
        if (iVar7 == 0) {
          iVar8 = 0;
          for (pQVar5 = (pQVar10->d).superdata.direct; pQVar5 != (QMetaObject *)0x0;
              pQVar5 = (pQVar5->d).superdata.direct) {
            iVar8 = iVar8 + (pQVar5->d).data[6];
          }
          iVar9 = iVar8 + iVar9;
          unaff_EBP = iVar9;
        }
        if (iVar7 == 0) break;
        iVar9 = iVar9 + 1;
        bVar6 = iVar9 < (int)uVar1;
      } while (iVar9 < (int)uVar1);
    }
    if (bVar6) {
      return unaff_EBP;
    }
    pQVar10 = (pQVar10->d).superdata.direct;
  } while( true );
}

Assistant:

int QMetaObject::indexOfProperty(const char *name) const
{
    const QMetaObject *m = this;
    while (m) {
        const QMetaObjectPrivate *d = priv(m->d.data);
        for (int i = 0; i < d->propertyCount; ++i) {
            const QMetaProperty::Data data = QMetaProperty::getMetaPropertyData(m, i);
            const char *prop = rawStringData(m, data.name());
            if (strcmp(name, prop) == 0) {
                i += m->propertyOffset();
                return i;
            }
        }
        m = m->d.superdata;
    }

    if (priv(this->d.data)->flags & DynamicMetaObject) {
        QAbstractDynamicMetaObject *me =
            const_cast<QAbstractDynamicMetaObject *>(static_cast<const QAbstractDynamicMetaObject *>(this));

        return me->createProperty(name, nullptr);
    }

    return -1;
}